

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall
cmState::AppendCacheEntryProperty
          (cmState *this,string *key,string *property,string *value,bool asString)

{
  CacheIterator local_28;
  
  local_28 = cmCacheManager::GetCacheIterator(this->CacheManager,(key->_M_dataplus)._M_p);
  cmCacheManager::CacheIterator::AppendProperty
            (&local_28,property,(value->_M_dataplus)._M_p,asString);
  return;
}

Assistant:

void cmState::AppendCacheEntryProperty(const std::string& key,
                                               const std::string& property,
                                               const std::string& value,
                                               bool asString)
{
  this->CacheManager
       ->GetCacheIterator(key.c_str()).AppendProperty(property,
                                                       value.c_str(),
                                                       asString);
}